

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m68kops.c
# Opt level: O3

void m68k_op_move_8_ix_al(void)

{
  uint value;
  uint addr_in;
  
  value = OPER_AL_8();
  addr_in = m68ki_get_ea_ix(*(uint *)((long)m68ki_cpu.dar + (ulong)(m68ki_cpu.ir >> 7 & 0x1c) + 0x20
                                     ));
  my_fc_handler(m68ki_cpu.s_flag | 1);
  if (m68ki_cpu.pmmu_enabled != 0) {
    addr_in = pmmu_translate_addr(addr_in);
  }
  m68k_write_memory_8(addr_in & m68ki_cpu.address_mask,value);
  m68ki_cpu.n_flag = value;
  m68ki_cpu.not_z_flag = value;
  m68ki_cpu.v_flag = 0;
  m68ki_cpu.c_flag = 0;
  return;
}

Assistant:

static void m68k_op_move_8_ix_al(void)
{
	uint res = OPER_AL_8();
	uint ea = EA_AX_IX_8();

	m68ki_write_8(ea, res);

	FLAG_N = NFLAG_8(res);
	FLAG_Z = res;
	FLAG_V = VFLAG_CLEAR;
	FLAG_C = CFLAG_CLEAR;
}